

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
::destroy_element(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                  *this,element_type *p)

{
  pointer p_00;
  
  p_00 = (p->second).binds.
         super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (p_00 != (pointer)0x0) {
    operator_delete(p_00,(long)(p->second).binds.
                               super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p_00);
  }
  ~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               *)&(p->second).childNodes);
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 *)&p->second);
  return;
}

Assistant:

void destroy_element(element_type* p) noexcept { type_policy::destroy(al(), p); }